

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

type __thiscall
fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[6],char_const*&,int_const&,true>
          (v7 *this,buffer_appender<char> out,char (*format_str) [6],char **args,int *args_1)

{
  type tVar1;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> local_48;
  undefined8 local_38 [2];
  ulong local_28;
  
  local_38[0] = *(undefined8 *)format_str;
  local_28 = (ulong)*(uint *)args;
  local_48 = to_string_view<char,_0>
                       ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container);
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)args_1
  ;
  args_00.desc_ = (unsigned_long_long)local_38;
  tVar1 = vformat_to<fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,char,true>
                    (this,(buffer_appender<char>)&local_48,(basic_string_view<char> *)0x1c,args_00);
  return (type)tVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline auto format_to(OutputIt out, const S& format_str, Args&&... args) ->
    typename std::enable_if<enable, OutputIt>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to(out, to_string_view(format_str), vargs);
}